

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

int __thiscall tinyxml2::XMLElement::IntAttribute(XMLElement *this,char *name)

{
  XMLAttribute *this_00;
  int i;
  int local_c;
  
  local_c = 0;
  this_00 = FindAttribute(this,name);
  if (this_00 == (XMLAttribute *)0x0) {
    local_c = 0;
  }
  else {
    XMLAttribute::QueryIntValue(this_00,&local_c);
  }
  return local_c;
}

Assistant:

int		 IntAttribute( const char* name ) const		{
        int i=0;
        QueryIntAttribute( name, &i );
        return i;
    }